

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_3_4::Xdr::read<(anonymous_namespace)::CharIO,std::istream>
               (basic_istream<char,_std::char_traits<char>_> *in,double *v)

{
  undefined8 *in_RSI;
  anon_union_8_2_94730066 u;
  uchar b [8];
  uchar *in_stack_ffffffffffffffd8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  readUnsignedChars<(anonymous_namespace)::CharIO,std::istream>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  *in_RSI = local_18;
  return;
}

Assistant:

void
read (T& in, double& v)
{
    unsigned char b[8];

    readUnsignedChars<S> (in, b, 8);

    union
    {
        uint64_t i;
        double   d;
    } u;

    u.i = ((uint64_t) b[0] & 0x00000000000000ffULL) |
          (((uint64_t) b[1] << 8) & 0x000000000000ff00ULL) |
          (((uint64_t) b[2] << 16) & 0x0000000000ff0000ULL) |
          (((uint64_t) b[3] << 24) & 0x00000000ff000000ULL) |
          (((uint64_t) b[4] << 32) & 0x000000ff00000000ULL) |
          (((uint64_t) b[5] << 40) & 0x0000ff0000000000ULL) |
          (((uint64_t) b[6] << 48) & 0x00ff000000000000ULL) |
          ((uint64_t) b[7] << 56);

    v = u.d;
}